

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlcatalog.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  byte *__ptr;
  FILE *pFVar8;
  ulong uVar9;
  byte *pbVar10;
  byte bVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  byte *pbVar18;
  char command [100];
  char arg [400];
  int local_2e8;
  undefined4 local_2d8;
  char cStack_2d4;
  undefined1 uStack_2d3;
  undefined1 uStack_2d2;
  undefined1 uStack_2d1;
  long local_268 [20];
  byte local_1c8 [408];
  
  if (argc < 2) {
    printf("Usage : %s [options] catalogfile entities...\n\tParse the catalog file (void specification possibly expressed as \"\"\n\tappoints the default system one) and query it for the entities\n\t--sgml : handle SGML Super catalogs for --add and --del\n\t--shell : run a shell allowing interactive queries\n\t--create : create a new catalog\n\t--add \'type\' \'orig\' \'replace\' : add an XML entry\n\t--add \'entry\' : add an SGML entry\n"
           ,*argv);
    puts(
        "\t--del \'values\' : remove values\n\t--noout: avoid dumping the result on stdout\n\t         used with --add or --del, it saves the catalog changes\n\t         and with --sgml it automatically updates the super catalog\n\t--no-super-update: do not update the SGML super catalog\n\t-v --verbose : provide debug information"
        );
    return 1;
  }
  xmlCheckVersion(0x526c);
  iVar15 = 1;
  do {
    pcVar13 = argv[iVar15];
    if ((*pcVar13 != '-') || (pcVar13[1] == '\0')) break;
    iVar3 = strcmp(pcVar13,"-verbose");
    if ((iVar3 == 0) ||
       (((pcVar13[1] == 'v' && (pcVar13[2] == '\0')) ||
        (iVar3 = strcmp(pcVar13,"--verbose"), iVar3 == 0)))) {
      verbose = verbose + 1;
      xmlCatalogSetDebug();
    }
    else {
      iVar3 = strcmp(pcVar13,"-noout");
      if ((iVar3 != 0) && (iVar3 = strcmp(pcVar13,"--noout"), iVar3 != 0)) {
        iVar3 = strcmp(pcVar13,"-shell");
        if ((iVar3 != 0) && (iVar3 = strcmp(pcVar13,"--shell"), iVar3 != 0)) {
          iVar3 = strcmp(pcVar13,"-sgml");
          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--sgml"), iVar3 == 0)) {
            sgml = sgml + 1;
          }
          else {
            iVar3 = strcmp(pcVar13,"-create");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--create"), iVar3 == 0)) {
              create = create + 1;
            }
            else {
              iVar3 = strcmp(pcVar13,"-convert");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--convert"), iVar3 == 0)) {
                convert = convert + 1;
              }
              else {
                iVar3 = strcmp(pcVar13,"-no-super-update");
                if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--no-super-update"), iVar3 == 0)) {
                  no_super_update = no_super_update + 1;
                }
                else {
                  iVar3 = strcmp(pcVar13,"-add");
                  if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--add"), iVar3 == 0)) {
                    iVar15 = iVar15 + 2 + (uint)(sgml == 0);
                    add = add + 1;
                  }
                  else {
                    iVar3 = strcmp(pcVar13,"-del");
                    if ((iVar3 != 0) && (iVar3 = strcmp(pcVar13,"--del"), iVar3 != 0)) {
                      main_cold_1();
                      return 1;
                    }
                    iVar15 = iVar15 + 1;
                    del = del + 1;
                  }
                }
              }
            }
          }
          goto LAB_001016fa;
        }
        shell = shell + 1;
      }
      noout = 1;
    }
LAB_001016fa:
    iVar15 = iVar15 + 1;
  } while (iVar15 < argc);
  iVar15 = sgml;
  uVar16 = 1;
  do {
    pcVar13 = argv[(int)uVar16];
    iVar3 = strcmp(pcVar13,"-add");
    if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--add"), iVar3 == 0)) {
      if (iVar15 == 0) {
        uVar17 = uVar16 + 3;
      }
      else {
        uVar17 = uVar16 + 2;
      }
    }
    else {
      iVar3 = strcmp(pcVar13,"-del");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--del"), iVar3 == 0)) {
        uVar17 = uVar16 + 1;
        if ((uVar17 == argc) || ((iVar15 != 0 && (uVar16 + 2 == argc)))) {
          main_cold_2();
          return 1;
        }
      }
      else {
        uVar17 = uVar16;
        if (*pcVar13 != '-') {
          if ((*pcVar13 == '\0') && (filename == (char *)0x0)) {
            xmlInitializeCatalog();
          }
          else {
            filename = pcVar13;
            iVar15 = xmlLoadCatalog(pcVar13);
            if ((iVar15 < 0) && (create != 0)) {
              xmlCatalogAdd("catalog",argv[(int)uVar16],0);
            }
          }
          break;
        }
      }
    }
    uVar16 = uVar17 + 1;
  } while ((int)uVar16 < argc);
  if (convert != 0) {
    xmlCatalogConvert();
  }
  if (del == 0 && add == 0) {
    if (shell == 0) {
      iVar15 = uVar16 + 1;
      local_2e8 = 0;
      if (iVar15 < argc) {
        lVar6 = 0;
        local_2e8 = 0;
        do {
          lVar7 = xmlParseURI(argv[iVar15 + lVar6]);
          if (lVar7 == 0) {
            pcVar13 = (char *)xmlCatalogResolvePublic(argv[iVar15 + lVar6]);
            if (pcVar13 != (char *)0x0) goto LAB_0010216a;
            pcVar13 = argv[iVar15 + lVar6];
            pcVar14 = "No entry for PUBLIC %s\n";
LAB_00102189:
            printf(pcVar14,pcVar13);
            local_2e8 = 4;
          }
          else {
            xmlFreeURI(lVar7);
            pcVar13 = (char *)xmlCatalogResolveSystem(argv[iVar15 + lVar6]);
            if (pcVar13 == (char *)0x0) {
              printf("No entry for SYSTEM %s\n",argv[iVar15 + lVar6]);
              pcVar13 = (char *)xmlCatalogResolveURI(argv[iVar15 + lVar6]);
              if (pcVar13 == (char *)0x0) {
                pcVar13 = argv[iVar15 + lVar6];
                pcVar14 = "No entry for URI %s\n";
                goto LAB_00102189;
              }
            }
LAB_0010216a:
            puts(pcVar13);
            (*_xmlFree)(pcVar13);
          }
          lVar6 = lVar6 + 1;
        } while (~uVar16 + argc != (int)lVar6);
      }
    }
    else {
      __ptr = (byte *)readline("> ");
      while (__ptr != (byte *)0x0) {
        pbVar18 = __ptr;
        if (*__ptr != 0) {
          add_history(__ptr);
        }
        for (; (bVar11 = *pbVar18, bVar11 == 9 || (bVar11 == 0x20)); pbVar18 = pbVar18 + 1) {
        }
        uVar9 = 0;
        while ((0x20 < bVar11 || ((0x100002601U >> ((ulong)bVar11 & 0x3f) & 1) == 0))) {
          *(byte *)((long)&local_2d8 + uVar9) = bVar11;
          bVar11 = pbVar18[uVar9 + 1];
          uVar9 = uVar9 + 1;
        }
        *(undefined1 *)((long)&local_2d8 + (uVar9 & 0xffffffff)) = 0;
        if (uVar9 == 0) goto LAB_00102072;
        memset(local_1c8,0,400);
        for (pbVar18 = pbVar18 + uVar9; (bVar11 = *pbVar18, bVar11 == 9 || (bVar11 == 0x20));
            pbVar18 = pbVar18 + 1) {
        }
        uVar9 = 0;
        while ((0xd < bVar11 || ((0x2401U >> (bVar11 & 0x1f) & 1) == 0))) {
          local_1c8[uVar9] = bVar11;
          bVar11 = pbVar18[uVar9 + 1];
          uVar9 = uVar9 + 1;
        }
        local_1c8[uVar9 & 0xffffffff] = 0;
        iVar15 = 0;
        memset(local_268,0,0xa0);
        if (local_1c8[0] != 0) {
          lVar6 = 0;
          iVar15 = 0;
          pbVar18 = local_1c8;
          bVar11 = local_1c8[0];
LAB_00101cd4:
          do {
            pbVar10 = pbVar18 + 1;
            if (bVar11 < 0x20) {
              if (bVar11 == 9) goto LAB_00101d0c;
LAB_00101d29:
              local_268[lVar6] = (long)pbVar18;
              pbVar10 = pbVar18;
              while ((0x20 < (ulong)*pbVar10 ||
                     ((0x100000201U >> ((ulong)*pbVar10 & 0x3f) & 1) == 0))) {
                pbVar10 = pbVar10 + 1;
              }
            }
            else {
              if (bVar11 == 0x20) {
LAB_00101d0c:
                bVar11 = *pbVar10;
                pbVar18 = pbVar10;
                goto LAB_00101cd4;
              }
              if (bVar11 == 0x22) {
                local_268[lVar6] = (long)pbVar10;
                while( true ) {
                  if (*pbVar10 == 0) goto LAB_00101d5e;
                  if (*pbVar10 == 0x22) break;
                  pbVar10 = pbVar10 + 1;
                }
              }
              else {
                if (bVar11 != 0x27) goto LAB_00101d29;
                local_268[lVar6] = (long)pbVar10;
                while( true ) {
                  if (*pbVar10 == 0) goto LAB_00101d5e;
                  if (*pbVar10 == 0x27) break;
                  pbVar10 = pbVar10 + 1;
                }
              }
            }
            *pbVar10 = 0;
            iVar15 = iVar15 + 1;
            lVar6 = lVar6 + 1;
            bVar11 = pbVar10[1];
            pbVar18 = pbVar10 + 1;
          } while (bVar11 != 0);
        }
LAB_00101d5e:
        if (((cStack_2d4 == '\0' && local_2d8 == 0x74697865) ||
            (cStack_2d4 == '\0' && local_2d8 == 0x74697571)) || (local_2d8 == 0x657962)) {
          free(__ptr);
          break;
        }
        if (CONCAT13(uStack_2d2,CONCAT12(uStack_2d3,CONCAT11(cStack_2d4,local_2d8._3_1_))) ==
            0x63696c && local_2d8 == 0x6c627570) {
          if (iVar15 != 1) {
            pcVar13 = "public requires 1 arguments";
            goto LAB_0010206d;
          }
          pcVar13 = (char *)xmlCatalogResolvePublic(local_268[0]);
          if (pcVar13 != (char *)0x0) goto LAB_00101e44;
          pcVar13 = "No entry for PUBLIC %s\n";
LAB_00102013:
          printf(pcVar13);
        }
        else {
          if (CONCAT13(uStack_2d2,CONCAT12(uStack_2d3,CONCAT11(cStack_2d4,local_2d8._3_1_))) ==
              0x6d6574 && local_2d8 == 0x74737973) {
            if (iVar15 == 1) {
              pcVar13 = (char *)xmlCatalogResolveSystem(local_268[0]);
              if (pcVar13 == (char *)0x0) {
                pcVar13 = "No entry for SYSTEM %s\n";
                goto LAB_00102013;
              }
LAB_00101e44:
              puts(pcVar13);
LAB_00101e52:
              (*_xmlFree)(pcVar13);
              goto LAB_00102072;
            }
            pcVar13 = "system requires 1 arguments";
          }
          else if (local_2d8 == 0x6c6564) {
            if (iVar15 == 1) {
              iVar15 = xmlCatalogRemove(local_268[0]);
              if (0 < iVar15) goto LAB_00102072;
              pcVar13 = "del command failed";
            }
            else {
              pcVar13 = "del requires 1";
            }
          }
          else if (local_2d8 == 0x646461) {
            if (iVar15 - 4U < 0xfffffffe) {
              pcVar13 = "add requires 2 or 3 arguments";
            }
            else {
              lVar6 = local_268[2];
              lVar7 = local_268[1];
              if (local_268[2] == 0) {
                lVar6 = local_268[1];
                lVar7 = 0;
              }
              iVar15 = xmlCatalogAdd(local_268[0],lVar7,lVar6);
              if (iVar15 == 0) goto LAB_00102072;
              pcVar13 = "add command failed";
            }
          }
          else if (CONCAT17(uStack_2d1,
                            CONCAT16(uStack_2d2,CONCAT15(uStack_2d3,CONCAT14(cStack_2d4,local_2d8)))
                           ) == 0x65766c6f736572) {
            if (iVar15 == 2) {
              pcVar13 = (char *)xmlCatalogResolve(local_268[0]);
              if (pcVar13 != (char *)0x0) {
                puts(pcVar13);
                goto LAB_00101e52;
              }
              pcVar13 = "Resolver failed to find an answer";
            }
            else {
              pcVar13 = "resolve requires 2 arguments";
            }
          }
          else if (cStack_2d4 == '\0' && local_2d8 == 0x706d7564) {
            if (iVar15 == 0) {
              xmlCatalogDump(_stdout);
              goto LAB_00102072;
            }
            pcVar13 = "dump has no arguments";
          }
          else if (CONCAT11(uStack_2d3,cStack_2d4) == 0x67 && local_2d8 == 0x75626564) {
            if (iVar15 == 0) {
              verbose = verbose + 1;
LAB_001020c4:
              xmlCatalogSetDebug();
              goto LAB_00102072;
            }
            pcVar13 = "debug has no arguments";
          }
          else if (CONCAT11(uStack_2d3,cStack_2d4) == 0x74 && local_2d8 == 0x65697571) {
            if (iVar15 == 0) {
              if (0 < verbose) {
                verbose = verbose + -1;
              }
              goto LAB_001020c4;
            }
            pcVar13 = "quiet has no arguments";
          }
          else {
            if (cStack_2d4 != '\0' || local_2d8 != 0x706c6568) {
              printf("Unrecognized command %s\n");
            }
            puts("Commands available:");
            puts("\tpublic PublicID: make a PUBLIC identifier lookup");
            puts("\tsystem SystemID: make a SYSTEM identifier lookup");
            puts("\tresolve PublicID SystemID: do a full resolver lookup");
            puts("\tadd \'type\' \'orig\' \'replace\' : add an entry");
            puts("\tdel \'values\' : remove values");
            puts("\tdump: print the current catalog state");
            puts("\tdebug: increase the verbosity level");
            puts("\tquiet: decrease the verbosity level");
            pcVar13 = "\texit:  quit the shell";
          }
LAB_0010206d:
          puts(pcVar13);
        }
LAB_00102072:
        free(__ptr);
        __ptr = (byte *)readline("> ");
      }
      local_2e8 = 0;
    }
  }
  else {
    local_2e8 = 0;
    iVar15 = 1;
    do {
      pcVar13 = argv[iVar15];
      iVar3 = iVar15;
      if (*pcVar13 == '-') {
        if (pcVar13[1] == '\0') break;
        ppcVar2 = argv + iVar15;
        iVar4 = strcmp(pcVar13,"-add");
        if ((iVar4 == 0) || (iVar4 = strcmp(pcVar13,"--add"), iVar4 == 0)) {
          if (sgml == 0) {
LAB_00101a2f:
            pcVar13 = argv[(long)iVar15 + 3];
            if ((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) {
              pcVar14 = ppcVar2[1];
              pcVar13 = ppcVar2[2];
              pcVar12 = (char *)0x0;
            }
            else {
              pcVar14 = ppcVar2[1];
              pcVar12 = ppcVar2[2];
            }
            iVar4 = xmlCatalogAdd(pcVar14,pcVar12,pcVar13);
            iVar3 = iVar15 + 3;
            if (iVar4 != 0) {
              puts("add command failed");
              local_2e8 = 3;
            }
          }
          else {
LAB_0010192f:
            ppcVar1 = ppcVar2 + 1;
            lVar6 = xmlLoadSGMLSuperCatalog(ppcVar2[1]);
            pcVar13 = *ppcVar2;
            iVar3 = strcmp(pcVar13,"-add");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--add"), iVar3 == 0)) {
              if (lVar6 == 0) {
                lVar6 = xmlNewCatalog(1);
              }
              xmlACatalogAdd(lVar6,"CATALOG",ppcVar2[2],0);
              if (no_super_update == 0) {
                lVar7 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog");
                if (lVar7 == 0) {
                  lVar7 = xmlNewCatalog(1);
                }
                xmlACatalogAdd(lVar7,"CATALOG",*ppcVar1,0);
              }
              else {
LAB_00101a27:
                lVar7 = 0;
              }
LAB_00101ab7:
              if (noout != 0) goto LAB_00101ac0;
LAB_00101adf:
              xmlACatalogDump(lVar6,_stdout);
            }
            else {
              if ((lVar6 == 0) || (iVar3 = xmlACatalogRemove(lVar6,ppcVar2[2]), iVar3 < 0)) {
                main_cold_4();
                local_2e8 = 1;
              }
              if (((lVar6 != 0) && (no_super_update == 0)) && ((noout & 1) != 0)) {
                iVar3 = xmlCatalogIsEmpty(lVar6);
                if ((iVar3 == 0) ||
                   (lVar7 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog"), lVar7 == 0))
                goto LAB_00101a27;
                iVar3 = xmlACatalogRemove(lVar7,*ppcVar1);
                if (iVar3 < 0) {
                  main_cold_5();
                  local_2e8 = 1;
                }
                goto LAB_00101ab7;
              }
              if ((noout & 1) == 0) goto LAB_00101adf;
              lVar7 = 0;
LAB_00101ac0:
              iVar3 = xmlCatalogIsEmpty(lVar6);
              if (iVar3 == 0) {
                pFVar8 = fopen64(*ppcVar1,"w");
                if (pFVar8 == (FILE *)0x0) {
                  main_cold_6();
                  local_2e8 = 2;
                }
                else {
                  xmlACatalogDump(lVar6,pFVar8);
                  fclose(pFVar8);
                }
              }
              else {
                remove(*ppcVar1);
              }
              if ((lVar7 != 0) && (no_super_update == 0)) {
                iVar3 = xmlCatalogIsEmpty(lVar7);
                if (iVar3 == 0) {
                  pFVar8 = fopen64("/usr/local/etc/sgml/catalog","w");
                  if (pFVar8 == (FILE *)0x0) {
                    main_cold_7();
                    local_2e8 = 2;
                  }
                  else {
                    xmlACatalogDump(lVar7,pFVar8);
                    fclose(pFVar8);
                  }
                }
                else {
                  remove("/usr/local/etc/sgml/catalog");
                }
              }
            }
            iVar3 = iVar15 + 2;
          }
        }
        else {
          iVar5 = strcmp(pcVar13,"-del");
          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar13,"--del"), iVar5 == 0)) {
            if (sgml != 0) goto LAB_0010192f;
            if (iVar4 == 0) goto LAB_00101a2f;
            iVar4 = strcmp(pcVar13,"-del");
            if ((iVar4 == 0) || (iVar4 = strcmp(pcVar13,"--del"), iVar4 == 0)) {
              iVar3 = iVar15 + 1;
              iVar15 = xmlCatalogRemove(argv[(long)iVar15 + 1]);
              if (iVar15 < 0) {
                main_cold_3();
                local_2e8 = 1;
              }
            }
          }
        }
      }
      iVar15 = iVar3 + 1;
    } while (iVar15 < argc);
  }
  if ((sgml == 0) && ((((add != 0 || (del != 0)) || (create != 0)) || (convert != 0)))) {
    pFVar8 = _stdout;
    if ((((filename != (char *)0x0 & noout) == 1) && (*filename != '\0')) &&
       (pFVar8 = fopen64(filename,"w"), pFVar8 == (FILE *)0x0)) {
      main_cold_8();
      local_2e8 = 2;
    }
    else {
      xmlCatalogDump(pFVar8);
    }
  }
  xmlCleanupParser();
  xmlMemoryDump();
  return local_2e8;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int ret;
    int exit_value = 0;


    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }

    LIBXML_TEST_VERSION
    for (i = 1; i < argc ; i++) {
	if (!strcmp(argv[i], "-"))
	    break;

	if (argv[i][0] != '-')
	    break;
	if ((!strcmp(argv[i], "-verbose")) ||
	    (!strcmp(argv[i], "-v")) ||
	    (!strcmp(argv[i], "--verbose"))) {
	    verbose++;
	    xmlCatalogSetDebug(verbose);
	} else if ((!strcmp(argv[i], "-noout")) ||
	    (!strcmp(argv[i], "--noout"))) {
            noout = 1;
	} else if ((!strcmp(argv[i], "-shell")) ||
	    (!strcmp(argv[i], "--shell"))) {
	    shell++;
            noout = 1;
	} else if ((!strcmp(argv[i], "-sgml")) ||
	    (!strcmp(argv[i], "--sgml"))) {
	    sgml++;
	} else if ((!strcmp(argv[i], "-create")) ||
	    (!strcmp(argv[i], "--create"))) {
	    create++;
	} else if ((!strcmp(argv[i], "-convert")) ||
	    (!strcmp(argv[i], "--convert"))) {
	    convert++;
	} else if ((!strcmp(argv[i], "-no-super-update")) ||
	    (!strcmp(argv[i], "--no-super-update"))) {
	    no_super_update++;
	} else if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    add++;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;
	    del++;
	} else {
	    fprintf(stderr, "Unknown option %s\n", argv[i]);
	    usage(argv[0]);
	    return(1);
	}
    }

    for (i = 1; i < argc; i++) {
	if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    continue;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;

	    /* No catalog entry specified */
	    if (i == argc || (sgml && i + 1 == argc)) {
		fprintf(stderr, "No catalog entry specified to remove from\n");
		usage (argv[0]);
		return(1);
	    }

	    continue;
	} else if (argv[i][0] == '-')
	    continue;

	if (filename == NULL && argv[i][0] == '\0') {
	    /* Interpret empty-string catalog specification as
	       a shortcut for a default system catalog. */
	    xmlInitializeCatalog();
	} else {
	    filename = argv[i];
	    ret = xmlLoadCatalog(argv[i]);
	    if ((ret < 0) && (create)) {
		xmlCatalogAdd(BAD_CAST "catalog", BAD_CAST argv[i], NULL);
	    }
	}
	break;
    }

    if (convert)
        ret = xmlCatalogConvert();

    if ((add) || (del)) {
	for (i = 1; i < argc ; i++) {
	    if (!strcmp(argv[i], "-"))
		break;

	    if (argv[i][0] != '-')
		continue;
	    if (strcmp(argv[i], "-add") && strcmp(argv[i], "--add") &&
		strcmp(argv[i], "-del") && strcmp(argv[i], "--del"))
		continue;

	    if (sgml) {
		/*
		 * Maintenance of SGML catalogs.
		 */
		xmlCatalogPtr catal = NULL;
		xmlCatalogPtr super = NULL;

		catal = xmlLoadSGMLSuperCatalog(argv[i + 1]);

		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
		    if (catal == NULL)
			catal = xmlNewCatalog(1);
		    xmlACatalogAdd(catal, BAD_CAST "CATALOG",
					 BAD_CAST argv[i + 2], NULL);

		    if (!no_super_update) {
			super = xmlLoadSGMLSuperCatalog(XML_SGML_DEFAULT_CATALOG);
			if (super == NULL)
			    super = xmlNewCatalog(1);

			xmlACatalogAdd(super, BAD_CAST "CATALOG",
					     BAD_CAST argv[i + 1], NULL);
		    }
		} else {
		    if (catal != NULL)
			ret = xmlACatalogRemove(catal, BAD_CAST argv[i + 2]);
		    else
			ret = -1;
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry from %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    if ((!no_super_update) && (noout) && (catal != NULL) &&
			(xmlCatalogIsEmpty(catal))) {
			super = xmlLoadSGMLSuperCatalog(
				   XML_SGML_DEFAULT_CATALOG);
			if (super != NULL) {
			    ret = xmlACatalogRemove(super,
				    BAD_CAST argv[i + 1]);
			    if (ret < 0) {
				fprintf(stderr,
					"Failed to remove entry from %s\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 1;
			    }
			}
		    }
		}
		if (noout) {
		    FILE *out;

		    if (xmlCatalogIsEmpty(catal)) {
			remove(argv[i + 1]);
		    } else {
			out = fopen(argv[i + 1], "w");
			if (out == NULL) {
			    fprintf(stderr, "could not open %s for saving\n",
				    argv[i + 1]);
			    exit_value = 2;
			    noout = 0;
			} else {
			    xmlACatalogDump(catal, out);
			    fclose(out);
			}
		    }
		    if (!no_super_update && super != NULL) {
			if (xmlCatalogIsEmpty(super)) {
			    remove(XML_SGML_DEFAULT_CATALOG);
			} else {
			    out = fopen(XML_SGML_DEFAULT_CATALOG, "w");
			    if (out == NULL) {
				fprintf(stderr,
					"could not open %s for saving\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 2;
				noout = 0;
			    } else {

				xmlACatalogDump(super, out);
				fclose(out);
			    }
			}
		    }
		} else {
		    xmlACatalogDump(catal, stdout);
		}
		i += 2;
	    } else {
		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
			if ((argv[i + 3] == NULL) || (argv[i + 3][0] == 0))
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1], NULL,
						BAD_CAST argv[i + 2]);
			else
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1],
						BAD_CAST argv[i + 2],
						BAD_CAST argv[i + 3]);
			if (ret != 0) {
			    printf("add command failed\n");
			    exit_value = 3;
			}
			i += 3;
		} else if ((!strcmp(argv[i], "-del")) ||
		    (!strcmp(argv[i], "--del"))) {
		    ret = xmlCatalogRemove(BAD_CAST argv[i + 1]);
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    i += 1;
		}
	    }
	}

    } else if (shell) {
	usershell();
    } else {
	for (i++; i < argc; i++) {
	    xmlURIPtr uri;
	    xmlChar *ans;

	    uri = xmlParseURI(argv[i]);
	    if (uri == NULL) {
		ans = xmlCatalogResolvePublic((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for PUBLIC %s\n", argv[i]);
		    exit_value = 4;
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    } else {
                xmlFreeURI(uri);
		ans = xmlCatalogResolveSystem((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for SYSTEM %s\n", argv[i]);
		    ans = xmlCatalogResolveURI ((const xmlChar *) argv[i]);
		    if (ans == NULL) {
			printf ("No entry for URI %s\n", argv[i]);
		        exit_value = 4;
		    } else {
		        printf("%s\n", (char *) ans);
			xmlFree (ans);
		    }
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    }
	}
    }
    if ((!sgml) && ((add) || (del) || (create) || (convert))) {
	if (noout && filename && *filename) {
	    FILE *out;

	    out = fopen(filename, "w");
	    if (out == NULL) {
		fprintf(stderr, "could not open %s for saving\n", filename);
		exit_value = 2;
		noout = 0;
	    } else {
		xmlCatalogDump(out);
	    }
	} else {
	    xmlCatalogDump(stdout);
	}
    }

    /*
     * Cleanup and check for memory leaks
     */
    xmlCleanupParser();
    xmlMemoryDump();
    return(exit_value);
}